

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# two_level_iterator.cc
# Opt level: O0

void __thiscall leveldb::anon_unknown_7::TwoLevelIterator::InitDataBlock(TwoLevelIterator *this)

{
  bool bVar1;
  int iVar2;
  Iterator *pIVar3;
  char *pcVar4;
  Iterator *iter;
  undefined1 local_20 [8];
  Slice handle;
  TwoLevelIterator *this_local;
  
  handle.size_ = (size_t)this;
  bVar1 = IteratorWrapper::Valid(&this->index_iter_);
  if (bVar1) {
    _local_20 = IteratorWrapper::value(&this->index_iter_);
    pIVar3 = IteratorWrapper::iter(&this->data_iter_);
    bVar1 = false;
    if (pIVar3 != (Iterator *)0x0) {
      Slice::Slice((Slice *)&iter,&this->data_block_handle_);
      iVar2 = Slice::compare((Slice *)local_20,(Slice *)&iter);
      bVar1 = iVar2 == 0;
    }
    if (!bVar1) {
      pIVar3 = (*this->block_function_)(this->arg_,&this->options_,(Slice *)local_20);
      pcVar4 = Slice::data((Slice *)local_20);
      Slice::size((Slice *)local_20);
      std::__cxx11::string::assign((char *)&this->data_block_handle_,(ulong)pcVar4);
      SetDataIterator(this,pIVar3);
    }
  }
  else {
    SetDataIterator(this,(Iterator *)0x0);
  }
  return;
}

Assistant:

void TwoLevelIterator::InitDataBlock() {
  if (!index_iter_.Valid()) {
    SetDataIterator(nullptr);
  } else {
    Slice handle = index_iter_.value();
    if (data_iter_.iter() != nullptr &&
        handle.compare(data_block_handle_) == 0) {
      // data_iter_ is already constructed with this iterator, so
      // no need to change anything
    } else {
      Iterator* iter = (*block_function_)(arg_, options_, handle);
      data_block_handle_.assign(handle.data(), handle.size());
      SetDataIterator(iter);
    }
  }
}